

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaliperMetadataDB.cpp
# Opt level: O2

Node * __thiscall
cali::CaliperMetadataDB::CaliperMetadataDBImpl::recursive_merge_node
          (CaliperMetadataDBImpl *this,Node *node,CaliperMetadataAccessInterface *db)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  Node *pNVar3;
  Node *pNVar4;
  char *str;
  size_t len;
  cali_id_t prnt_id;
  Variant v_data;
  cali_variant_t local_48;
  
  if (node != (Node *)0x0) {
    uVar1 = node->m_id;
    if (uVar1 == 0xffffffffffffffff) {
      pNVar3 = (Node *)0x0;
    }
    else if (uVar1 < 0xc) {
      pNVar3 = (this->m_nodes).super__Vector_base<cali::Node_*,_std::allocator<cali::Node_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar1];
    }
    else {
      iVar2 = (**db->_vptr_CaliperMetadataAccessInterface)(db,node->m_attribute);
      pNVar3 = recursive_merge_node(this,(Node *)CONCAT44(extraout_var,iVar2),db);
      pNVar4 = recursive_merge_node
                         (this,*(Node **)((long)&(((node->super_LockfreeIntrusiveTree<cali::Node>).
                                                  m_me)->super_LockfreeIntrusiveTree<cali::Node>).
                                                 m_me +
                                         (node->super_LockfreeIntrusiveTree<cali::Node>).m_node),db)
      ;
      local_48 = (node->m_data).m_v;
      if ((char)(node->m_data).m_v.type_and_size == '\x04') {
        str = (char *)cali_variant_get_data(&local_48);
        len = Variant::size((Variant *)&local_48);
        local_48 = (cali_variant_t)make_string_variant(this,str,len);
      }
      if (pNVar4 == (Node *)0x0) {
        prnt_id = 0xffffffffffffffff;
      }
      else {
        prnt_id = pNVar4->m_id;
      }
      pNVar3 = merge_node(this,node->m_id,pNVar3->m_id,prnt_id,(Variant *)&local_48);
    }
    return pNVar3;
  }
  return (Node *)0x0;
}

Assistant:

Node* recursive_merge_node(Node* node, const CaliperMetadataAccessInterface& db)
    {
        if (!node || node->id() == CALI_INV_ID)
            return nullptr;
        if (node->id() < 12)
            return m_nodes[node->id()];

        Node* attr_node = recursive_merge_node(db.node(node->attribute()), db);
        Node* parent    = recursive_merge_node(node->parent(), db);

        Variant v_data = node->data();

        if (v_data.type() == CALI_TYPE_STRING)
            v_data = make_string_variant(static_cast<const char*>(v_data.data()), v_data.size());

        return merge_node(node->id(), attr_node->id(), parent ? parent->id() : CALI_INV_ID, v_data);
    }